

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BN.cpp
# Opt level: O1

BN * __thiscall BN::modbaseappr(BN *this,bt *diviser)

{
  pointer puVar1;
  divide_by_zero *this_00;
  uint uVar2;
  unsigned_short uVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  
  if (*diviser != 0) {
    puVar1 = (this->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar2 = 0;
    uVar3 = 0;
    lVar4 = (long)(this->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)puVar1;
    if (lVar4 != 0) {
      uVar5 = lVar4 >> 1;
      uVar6 = uVar5 - 1;
      do {
        uVar2 = (uint)puVar1[uVar6] | uVar2 << 0x10;
        puVar1[uVar6] = (unsigned_short)(uVar2 / *diviser);
        uVar2 = uVar2 % (uint)*diviser;
        uVar3 = (unsigned_short)uVar2;
        uVar6 = uVar6 - 1;
      } while (uVar6 < uVar5);
    }
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize(&this->ba,1);
    *(this->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
     super__Vector_impl_data._M_start = uVar3;
    return this;
  }
  this_00 = (divide_by_zero *)__cxa_allocate_exception(0x10);
  divide_by_zero::divide_by_zero(this_00);
  __cxa_throw(this_00,&divide_by_zero::typeinfo,std::logic_error::~logic_error);
}

Assistant:

BN& BN::modbaseappr(const bt &diviser)
{
    if(diviser == 0)
        throw divide_by_zero();
    bt2 curr = 0;
    for(size_t i = ba.size() - 1; i < ba.size(); --i) {
        curr <<= bz8;
        curr += ba[i];
        ba[i] = curr / diviser;
        curr %= diviser;
    }
    ba.resize(1);
    ba[0] = curr;
    return *this;
}